

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_gsupport.cpp
# Opt level: O3

void __kmp_GOMP_doacross_post<long,true>(long *count)

{
  kmp_info_t *th;
  long lVar1;
  int gtid;
  kmp_int64 *vec;
  long lVar2;
  
  gtid = __kmp_get_global_thread_id_reg();
  th = __kmp_threads[gtid];
  lVar1 = *(((th->th).th_dispatch)->field_8).th_doacross_info;
  vec = (kmp_int64 *)___kmp_thread_malloc(th,lVar1 * 8);
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      vec[lVar2] = count[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  __kmpc_doacross_post(&__kmp_GOMP_doacross_post<long,_true>::loc,gtid,vec);
  ___kmp_thread_free(th,vec);
  return;
}

Assistant:

void __kmp_GOMP_doacross_post<long, true>(long *count) {
  int gtid = __kmp_entry_gtid();
  kmp_info_t *th = __kmp_threads[gtid];
  MKLOC(loc, "GOMP_doacross_post");
  kmp_int64 num_dims = th->th.th_dispatch->th_doacross_info[0];
  kmp_int64 *vec =
      (kmp_int64 *)__kmp_thread_malloc(th, sizeof(kmp_int64) * num_dims);
  for (kmp_int64 i = 0; i < num_dims; ++i) {
    vec[i] = (kmp_int64)count[i];
  }
  __kmpc_doacross_post(&loc, gtid, vec);
  __kmp_thread_free(th, vec);
}